

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageChannel.cpp
# Opt level: O2

void __thiscall Imf_3_2::ImageChannel::boundsCheck(ImageChannel *this,int x,int y)

{
  ImageLevel *pIVar1;
  ostream *poVar2;
  ArgExc *pAVar3;
  stringstream _iex_throw_s;
  ostream local_198 [376];
  
  pIVar1 = this->_level;
  if (((((pIVar1->_dataWindow).min.x <= x) && (x <= (pIVar1->_dataWindow).max.x)) &&
      ((pIVar1->_dataWindow).min.y <= y)) && (y <= (pIVar1->_dataWindow).max.y)) {
    if ((x % this->_xSampling == 0) && (y % this->_ySampling == 0)) {
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar2 = std::operator<<(local_198,"Attempt to access a pixel at location (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
    poVar2 = std::operator<<(poVar2,") in a channel whose x and y sampling rates are ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_xSampling);
    poVar2 = std::operator<<(poVar2," and ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_ySampling);
    std::operator<<(poVar2,".  The pixel coordinates are not divisible by the sampling rates.");
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar3,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar3,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_198,"Attempt to access a pixel at location (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
  poVar2 = std::operator<<(poVar2,") in an image whose data window is (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pIVar1->_dataWindow).min.x);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pIVar1->_dataWindow).min.y);
  poVar2 = std::operator<<(poVar2,") - (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pIVar1->_dataWindow).max.x);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pIVar1->_dataWindow).max.y);
  std::operator<<(poVar2,").");
  pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar3,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar3,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
ImageChannel::boundsCheck (int x, int y) const
{
    const Box2i& dataWindow = level ().dataWindow ();

    if (x < dataWindow.min.x || x > dataWindow.max.x || y < dataWindow.min.y ||
        y > dataWindow.max.y)
    {
        THROW (
            ArgExc,
            "Attempt to access a pixel at location "
            "(" << x
                << ", " << y
                << ") in an image whose data window is "
                   "("
                << dataWindow.min.x << ", " << dataWindow.min.y
                << ") - "
                   "("
                << dataWindow.max.x << ", " << dataWindow.max.y << ").");
    }

    if (x % _xSampling || y % _ySampling)
    {
        THROW (
            ArgExc,
            "Attempt to access a pixel at location "
            "(" << x
                << ", " << y
                << ") in a channel whose x and y sampling "
                   "rates are "
                << _xSampling << " and " << _ySampling
                << ".  The "
                   "pixel coordinates are not divisible by the sampling rates.");
    }
}